

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::initCallbackProcessing(FederateState *this)

{
  IterationRequest iterate;
  uint uVar1;
  ActionMessage bye;
  
  uVar1 = (*((this->fedCallbacks).
             super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_FederateOperator[2])();
  iterate = (IterationRequest)uVar1;
  if (iterate == HALT_OPERATIONS) {
    ActionMessage::ActionMessage(&bye,cmd_disconnect);
    bye.source_id.gid = (this->global_id)._M_i.gid;
    bye.dest_id.gid = bye.source_id.gid;
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&bye);
  }
  else if ((uVar1 & 0xff) == 7) {
    ActionMessage::ActionMessage(&bye,cmd_local_error);
    bye.source_id.gid = (this->global_id)._M_i.gid;
    bye.messageID = -0x1d;
    bye.dest_id.gid = bye.source_id.gid;
    SmallBuffer::operator=
              (&bye.payload,
               (char (*) [71])
               "Callback federate unspecified error condition in initializing callback");
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&bye);
  }
  else {
    ActionMessage::ActionMessage(&bye,cmd_exec_request);
    bye.source_id.gid = (this->global_id)._M_i.gid;
    bye.dest_id.gid = (this->global_id)._M_i.gid;
    setIterationFlags(&bye,iterate);
    bye.flags._0_1_ = (byte)bye.flags | 0x20;
    BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&bye);
  }
  ActionMessage::~ActionMessage(&bye);
  this->lastIterationRequest = iterate;
  return;
}

Assistant:

void FederateState::initCallbackProcessing()
{
    auto initIter = fedCallbacks->initializeOperations();
    switch (initIter) {
        case IterationRequest::NO_ITERATIONS:
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
        default: {
            ActionMessage exec(CMD_EXEC_REQUEST);
            exec.source_id = global_id.load();
            exec.dest_id = global_id.load();
            setIterationFlags(exec, initIter);
            setActionFlag(exec, indicator_flag);
            mParent->addActionMessage(exec);
        } break;
        case IterationRequest::HALT_OPERATIONS: {
            ActionMessage bye(CMD_DISCONNECT);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            mParent->addActionMessage(bye);
        } break;
        case IterationRequest::ERROR_CONDITION:
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = "Callback federate unspecified error condition in initializing callback";
            mParent->addActionMessage(bye);
            break;
    }
    lastIterationRequest = initIter;
}